

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinFT98_X>
               (int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double lapl_a;
  double lapl_b;
  undefined8 uVar1;
  double dVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double vlb;
  double vla;
  double local_60;
  double local_58;
  long local_50;
  const_host_buffer_type local_48;
  const_host_buffer_type local_40;
  const_host_buffer_type local_38;
  
  if (0 < N) {
    lVar5 = (ulong)(uint)N << 4;
    lVar6 = 0;
    lVar4 = 0;
    local_50 = lVar5;
    local_48 = lapl;
    local_40 = rho;
    local_38 = tau;
    do {
      lapl_a = *(double *)((long)lapl + lVar6);
      lapl_b = *(double *)((long)lapl + lVar6 + 8);
      uVar1 = *(undefined8 *)((long)sigma + lVar4);
      dVar2 = *(double *)((long)sigma + lVar4 + 8);
      uVar3 = *(undefined8 *)((long)sigma + lVar4 + 0x10);
      auVar8 = *(undefined1 (*) [16])((long)rho + lVar6);
      auVar9 = *(undefined1 (*) [16])((long)tau + lVar6);
      *eps = 0.0;
      *(undefined8 *)((long)vrho + lVar6) = 0;
      ((undefined8 *)((long)vrho + lVar6))[1] = 0;
      *(undefined8 *)((long)vsigma + lVar4 + 0x10) = 0;
      *(undefined8 *)((long)vsigma + lVar4) = 0;
      ((undefined8 *)((long)vsigma + lVar4))[1] = 0;
      local_58 = 0.0;
      local_60 = 0.0;
      *(undefined8 *)((long)vtau + lVar6) = 0;
      ((undefined8 *)((long)vtau + lVar6))[1] = 0;
      if (1e-12 < auVar8._8_8_ + auVar8._0_8_) {
        auVar10._8_8_ = uVar3;
        auVar10._0_8_ = uVar1;
        auVar10 = maxpd(_DAT_01041250,auVar10);
        auVar8 = maxpd(_DAT_01041240,auVar8);
        auVar11 = maxpd(_DAT_01041200,auVar9);
        auVar9._0_8_ = auVar8._0_8_ * 8.0 * auVar11._0_8_;
        auVar9._8_8_ = auVar8._8_8_ * 8.0 * auVar11._8_8_;
        auVar9 = minpd(auVar9,auVar10);
        dVar12 = (auVar9._8_8_ + auVar9._0_8_) * 0.5;
        uVar7 = -(ulong)(-dVar12 <= dVar2);
        dVar2 = (double)(uVar7 & (ulong)dVar2 | ~uVar7 & (ulong)-dVar12);
        uVar7 = -(ulong)(dVar2 <= dVar12);
        kernel_traits<ExchCXX::BuiltinFT98_X>::eval_exc_vxc_polar_impl
                  (auVar8._0_8_,auVar8._8_8_,auVar9._0_8_,
                   (double)(~uVar7 & (ulong)dVar12 | uVar7 & (ulong)dVar2),auVar9._8_8_,lapl_a,
                   lapl_b,auVar11._0_8_,auVar11._8_8_,eps,(double *)((long)vrho + lVar6),
                   (double *)((long)vrho + lVar6 + 8),(double *)((long)vsigma + lVar4),
                   (double *)((long)vsigma + lVar4 + 8),(double *)((long)vsigma + lVar4 + 0x10),
                   &local_58,&local_60,(double *)((long)vtau + lVar6),
                   (double *)((long)vtau + lVar6 + 8));
        lapl = local_48;
        rho = local_40;
        lVar5 = local_50;
        tau = local_38;
      }
      *(double *)((long)vlapl + lVar6) = local_58;
      *(double *)((long)vlapl + lVar6 + 8) = local_60;
      lVar4 = lVar4 + 0x18;
      lVar6 = lVar6 + 0x10;
      eps = eps + 1;
    } while (lVar5 != lVar6);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_GENERATOR( host_eval_exc_vxc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;


    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double vla, vlb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      eps[i], vrho_i[0], vrho_i[1],
      vsigma_i[0], vsigma_i[1], vsigma_i[2], vla, vlb,
      vtau_i[0], vtau_i[1] );
    if(traits::needs_laplacian) {
      vlapl_i[0] = vla;
      vlapl_i[1] = vlb;
    }

  }

}